

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O0

Vec_Int_t * Gia_PolynReorder(Gia_Man_t *pGia,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vFadds_00;
  Vec_Int_t *vHadds_00;
  Vec_Int_t *p;
  Vec_Int_t *vNodes;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Obj_t *pObj;
  bool bVar4;
  int *pFanins_1;
  int *pFanins;
  int Attr;
  int Node;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vOrder2;
  Vec_Int_t *vOrder;
  Vec_Int_t *vRecord;
  Vec_Int_t *vHadds;
  Vec_Int_t *vFadds;
  int fVeryVerbose_local;
  int fVerbose_local;
  Gia_Man_t *pGia_local;
  
  vFadds_00 = Gia_ManDetectFullAdders(pGia,fVeryVerbose);
  vHadds_00 = Gia_ManDetectHalfAdders(pGia,fVeryVerbose);
  p = Gia_PolynFindOrder(pGia,vFadds_00,vHadds_00,fVerbose,fVeryVerbose);
  iVar1 = Gia_ManAndNum(pGia);
  vNodes = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManObjNum(pGia);
  p_00 = Vec_IntStart(iVar1);
  Gia_ManIncrementTravId(pGia);
  for (Entry = 0; iVar1 = Vec_IntSize(p), Entry < iVar1; Entry = Entry + 1) {
    Attr = Vec_IntEntry(p,Entry);
    iVar1 = Abc_Lit2Var2(Attr);
    iVar2 = Abc_Lit2Att2(Attr);
    if (iVar2 == 2) {
      piVar3 = Vec_IntEntryP(vFadds_00,iVar1 * 5);
      for (Node = 3; Node < 5; Node = Node + 1) {
        Gia_ManCollectAnds_rec(pGia,piVar3[Node],vNodes);
      }
    }
    else if (iVar2 == 1) {
      piVar3 = Vec_IntEntryP(vHadds_00,iVar1 << 1);
      for (Node = 0; Node < 2; Node = Node + 1) {
        Gia_ManCollectAnds_rec(pGia,piVar3[Node],vNodes);
      }
    }
    else {
      Gia_ManCollectAnds_rec(pGia,iVar1,vNodes);
    }
  }
  Entry = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCis);
    bVar4 = false;
    if (Entry < iVar1) {
      pObj = Gia_ManCi(pGia,Entry);
      Attr = Gia_ObjId(pGia,pObj);
      bVar4 = Attr != 0;
    }
    if (!bVar4) break;
    Vec_IntWriteEntry(p_00,Attr,Entry + 1);
    Entry = Entry + 1;
  }
  for (Entry = 0; iVar1 = Vec_IntSize(vNodes), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(vNodes,Entry);
    iVar2 = Gia_ManCiNum(pGia);
    Vec_IntWriteEntry(p_00,iVar1,iVar2 + 1 + Entry);
  }
  Vec_IntFree(p);
  Vec_IntFree(vFadds_00);
  Vec_IntFree(vHadds_00);
  Vec_IntFree(vNodes);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_PolynReorder( Gia_Man_t * pGia, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vFadds  = Gia_ManDetectFullAdders( pGia, fVeryVerbose );
    Vec_Int_t * vHadds  = Gia_ManDetectHalfAdders( pGia, fVeryVerbose );
    Vec_Int_t * vRecord = Gia_PolynFindOrder( pGia, vFadds, vHadds, fVerbose, fVeryVerbose );
    Vec_Int_t * vOrder  = Vec_IntAlloc( Gia_ManAndNum(pGia) );
    Vec_Int_t * vOrder2 = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, Entry;

    // collect nodes
    Gia_ManIncrementTravId( pGia );
    Vec_IntForEachEntry( vRecord, Entry, i )
    {
        int Node = Abc_Lit2Var2(Entry);
        int Attr = Abc_Lit2Att2(Entry);
        if ( Attr == 2 )
        {
            int * pFanins = Vec_IntEntryP( vFadds, 5*Node );
            for ( k = 3; k < 5; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else if ( Attr == 1 )
        {
            int * pFanins = Vec_IntEntryP( vHadds, 2*Node );
            for ( k = 0; k < 2; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else
            Gia_ManCollectAnds_rec( pGia, Node, vOrder );
        //printf( "Order = %d.  Node = %d.  Size = %d ", i, Node, Vec_IntSize(vOrder) );
    }
    //printf( "\n" );
    //assert( Vec_IntSize(vOrder) == Gia_ManAndNum(pGia) );

    // remap order
    Gia_ManForEachCiId( pGia, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+i );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+Gia_ManCiNum(pGia)+i );
    //Vec_IntPrint( vOrder );

    Vec_IntFree( vRecord );
    Vec_IntFree( vFadds );
    Vec_IntFree( vHadds );
    Vec_IntFree( vOrder );
    return vOrder2;
}